

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O1

void __thiscall ymfm::ym2610::write_data_hi(ym2610 *this,uint8_t data)

{
  ushort uVar1;
  ymfm_interface *pyVar2;
  size_t in_RCX;
  
  uVar1 = this->m_address;
  if ((uVar1 >> 8 & 1) == 0) {
    return;
  }
  if (uVar1 < 0x130) {
    adpcm_a_engine::write(&this->m_adpcm_a,uVar1 & 0x3f,(void *)(ulong)data,in_RCX);
  }
  else {
    fm_engine_base<ymfm::opn_registers_base<true>_>::write
              ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm,(uint)uVar1,
               (void *)(ulong)data,in_RCX);
  }
  pyVar2 = (this->m_fm).m_intf;
  (*(code *)pyVar2->m_engine[3]._vptr_ymfm_engine_callbacks)
            (pyVar2,(ulong)(this->m_fm).m_clock_prescale << 5);
  return;
}

Assistant:

void ym2610::write_data_hi(uint8_t data)
{
	// ignore if paired with upper address
	if (!bitfield(m_address, 8))
		return;

	if (m_address < 0x130)
	{
		// 100-12F: write to ADPCM-A
		m_adpcm_a.write(m_address & 0x3f, data);
	}
	else
	{
		// 130-1FF: write to FM
		m_fm.write(m_address, data);
	}

	// mark busy for a bit
	m_fm.intf().ymfm_set_busy_end(32 * m_fm.clock_prescale());
}